

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void expectEqualIssuesSpecificationHeadingsUrls
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *issues,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *specificationHeadings,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *urls,LoggerPtr *logger)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  bool bVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  const_reference pvVar6;
  AssertHelper local_1c0 [8];
  Message local_1b8 [8];
  shared_ptr<libcellml::Issue> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_5;
  Message local_168 [8];
  shared_ptr<libcellml::Issue> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118 [8];
  shared_ptr<libcellml::Issue> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  size_t i;
  Message local_c0 [8];
  unsigned_long local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90 [8];
  unsigned_long local_88;
  size_type local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [24];
  unsigned_long local_48;
  size_type local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  LoggerPtr *logger_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *urls_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *specificationHeadings_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *issues_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)logger;
  local_40 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(issues);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_48 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_38,"issues.size()","logger->issueCount()",&local_40,&local_48)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar3) {
    testing::Message::Message(local_60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xe8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_80 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(specificationHeadings);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_88 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_78,"specificationHeadings.size()","logger->issueCount()",
             &local_80,&local_88);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar3) {
    testing::Message::Message(local_90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xe9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_b0 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(urls);
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             gtest_ar.message_.ptr_);
  local_b8 = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_a8,"urls.size()","logger->issueCount()",&local_b0,&local_b8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar3) {
    testing::Message::Message(local_c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0xea,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  gtest_ar_3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    sVar1.ptr_ = gtest_ar_3.message_.ptr_;
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             libcellml::Logger::issueCount();
    sVar2 = gtest_ar_3.message_;
    bVar3 = false;
    if (sVar1.ptr_ < pbVar5) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(issues);
      bVar3 = sVar2.ptr_ < pbVar5;
    }
    if (!bVar3) break;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(issues,(size_type)gtest_ar_3.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_110);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_110);
    libcellml::Issue::description_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_e0,"issues.at(i)","logger->issue(i)->description()",pvVar6,
               &local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_110);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar3) {
      testing::Message::Message(local_118);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0xec,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(specificationHeadings,(size_type)gtest_ar_3.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_160);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_160);
    libcellml::Issue::referenceHeading_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_130,"specificationHeadings.at(i)",
               "logger->issue(i)->referenceHeading()",pvVar6,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_160);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar3) {
      testing::Message::Message(local_168);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0xed,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_168);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(local_168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(urls,(size_type)gtest_ar_3.message_.ptr_);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               gtest_ar.message_.ptr_);
    libcellml::Logger::issue((ulong)&local_1b0);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_1b0);
    libcellml::Issue::url_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_180,"urls.at(i)","logger->issue(i)->url()",pvVar6,&local_1a0
              );
    std::__cxx11::string::~string((string *)&local_1a0);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1b0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar3) {
      testing::Message::Message(local_1b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                (local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                 ,0xee,pcVar4);
      testing::internal::AssertHelper::operator=(local_1c0,local_1b8);
      testing::internal::AssertHelper::~AssertHelper(local_1c0);
      testing::Message::~Message(local_1b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    gtest_ar_3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(gtest_ar_3.message_.ptr_)->field_0x1;
  }
  return;
}

Assistant:

void expectEqualIssuesSpecificationHeadingsUrls(const std::vector<std::string> &issues,
                                                const std::vector<std::string> &specificationHeadings,
                                                const std::vector<std::string> &urls,
                                                const libcellml::LoggerPtr &logger)
{
    EXPECT_EQ(issues.size(), logger->issueCount());
    EXPECT_EQ(specificationHeadings.size(), logger->issueCount());
    EXPECT_EQ(urls.size(), logger->issueCount());
    for (size_t i = 0; i < logger->issueCount() && i < issues.size(); ++i) {
        EXPECT_EQ(issues.at(i), logger->issue(i)->description());
        EXPECT_EQ(specificationHeadings.at(i), logger->issue(i)->referenceHeading());
        EXPECT_EQ(urls.at(i), logger->issue(i)->url());
    }
}